

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamahaCommands.hpp
# Opt level: O0

void __thiscall TI::TMS::Commands::Rectangle<false,_true>::~Rectangle(Rectangle<false,_true> *this)

{
  Rectangle<false,_true> *this_local;
  
  Command::~Command(&this->super_Command);
  return;
}

Assistant:

Rectangle(CommandContext &context, ModeDescription &mode_description) : Command(context, mode_description) {
			if constexpr (include_source) {
				start_x_[0] = context.source.v[0];
			}
			start_x_[1] = context.destination.v[0];
			width_ = context.size.v[0];

			if(!width_) {
				// Width = 0 => maximal width for this mode.
				// (aside: it's still unclear to me whether commands are
				// automatically clipped to the display; I think so but
				// don't want to spend any time on it until I'm certain)
//				context.size.v[0] = width_ = mode_description.width;
			}
		}